

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O1

char * iniparser_getstring(dictionary *d,char *key,char *def)

{
  char *key_00;
  char tmp_str [1025];
  char acStack_418 [1032];
  
  if (key != (char *)0x0 && d != (dictionary *)0x0) {
    key_00 = strlwc(key,acStack_418,0x401);
    def = dictionary_get(d,key_00,def);
  }
  return def;
}

Assistant:

const char * iniparser_getstring(const dictionary * d, const char * key, const char * def)
{
    const char * lc_key ;
    const char * sval ;
    char tmp_str[ASCIILINESZ + 1];

    if (d == NULL || key == NULL)
        return def ;

    lc_key = strlwc(key, tmp_str, sizeof(tmp_str));
    sval = dictionary_get(d, lc_key, def);
    return sval ;
}